

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall
klogic::mlmvn::export_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  pointer pcVar1;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  int k;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  int local_64;
  mlmvn *local_60;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  size_t n_neurons;
  size_t n_weights;
  
  pcVar1 = (all_weights->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((all_weights->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (all_weights->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = pcVar1;
  }
  piVar2 = (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_60 = this;
  get_stats(this,&n_weights,&n_neurons);
  local_50 = n_weights;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
            (all_weights,n_weights);
  local_58 = n_neurons;
  std::vector<int,_std::allocator<int>_>::reserve(k_values,n_neurons);
  uVar4 = 0;
  while( true ) {
    pvVar6 = (local_60->neurons).
             super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_60->neurons).
                       super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar4)
    break;
    pvVar6 = pvVar6 + uVar4;
    lVar7 = 0;
    local_48 = uVar4;
    for (uVar5 = 0;
        lVar3 = *(long *)&(pvVar6->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                          _M_impl,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar6->
                                       super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>
                                       )._M_impl + 8) - lVar3 >> 5); uVar5 = uVar5 + 1) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      insert<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,void>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)all_weights,
                 (all_weights->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish,*(complex<double> **)(lVar3 + lVar7),
                 *(complex<double> **)(lVar3 + 8 + lVar7));
      local_64 = *(int *)(*(long *)&(pvVar6->
                                    super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                                    _M_impl + 0x18 + lVar7);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(k_values,&local_64);
      lVar7 = lVar7 + 0x20;
    }
    uVar4 = local_48 + 1;
  }
  if ((long)(all_weights->
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(all_weights->
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4 == local_50) {
    if ((long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(k_values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 == local_58) {
      return;
    }
    __assert_fail("k_values.size() == n_neurons",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                  ,0xb9,
                  "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const")
    ;
  }
  __assert_fail("all_weights.size() == n_weights",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc",
                0xb8,
                "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const");
}

Assistant:

void klogic::mlmvn::export_neurons(klogic::cvector &all_weights, std::vector<int> &k_values) const
{
    all_weights.clear();
    k_values.clear();

    // calculate number of weights and reserve this size
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    all_weights.reserve(n_weights);
    k_values.reserve(n_neurons);

    for (int layer = 0; layer < layers_count(); ++layer) {
        const vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            const cvector &weights(layer_neurons[k].weights_vector());

            all_weights.insert(all_weights.end(), weights.begin(), weights.end());
            k_values.push_back(layer_neurons[k].k_value());
        }
    }

    // Sanity check
    assert(all_weights.size() == n_weights);
    assert(k_values.size() == n_neurons);
}